

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QString * __thiscall
QAccessibleLineEdit::textAtOffset
          (QAccessibleLineEdit *this,int offset,TextBoundaryType boundaryType,int *startOffset,
          int *endOffset)

{
  EchoMode EVar1;
  uint in_ECX;
  uint in_EDX;
  long *in_RSI;
  QLineEdit *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  int iVar2;
  QLineEdit *this_00;
  undefined4 local_14;
  
  this_00 = in_RDI;
  lineEdit((QAccessibleLineEdit *)0x7f0fd0);
  EVar1 = QLineEdit::echoMode(this_00);
  iVar2 = (int)this_00;
  if (EVar1 == Normal) {
    local_14 = in_EDX;
    if (in_EDX == 0xfffffffe) {
      local_14 = (**(code **)(*in_RSI + 0xd0))();
    }
    QAccessibleTextInterface::textAtOffset
              (iVar2,(int)in_RSI + 0x20,(int *)(ulong)local_14,(int *)(ulong)in_ECX);
  }
  else {
    *in_R9 = 0xffffffff;
    *in_R8 = 0xffffffff;
    QString::QString((QString *)0x7f0ffd);
  }
  return (QString *)in_RDI;
}

Assistant:

QString QAccessibleLineEdit::textAtOffset(int offset, QAccessible::TextBoundaryType boundaryType,
        int *startOffset, int *endOffset) const
{
    if (lineEdit()->echoMode() != QLineEdit::Normal) {
        *startOffset = *endOffset = -1;
        return QString();
    }
    if (offset == -2)
        offset = cursorPosition();
    return QAccessibleTextInterface::textAtOffset(offset, boundaryType, startOffset, endOffset);
}